

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar.c
# Opt level: O1

decaf_bool_t decaf_255_scalar_eq(decaf_255_scalar_s *a,decaf_255_scalar_s *b)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = 0;
  lVar1 = 0;
  do {
    uVar2 = uVar2 | b->limb[lVar1] ^ a->limb[lVar1];
    uVar3 = uVar3 | (b->limb + lVar1)[1] ^ (a->limb + lVar1)[1];
    lVar1 = lVar1 + 2;
  } while (lVar1 != 4);
  return ~-(ulong)(uVar3 != 0 || uVar2 != 0);
}

Assistant:

decaf_bool_t
API_NS(scalar_eq) (
    const scalar_t a,
    const scalar_t b
) {
    decaf_word_t diff = 0;
    unsigned int i;
    for (i=0; i<SCALAR_LIMBS; i++) {
        diff |= a->limb[i] ^ b->limb[i];
    }
    return mask_to_bool(word_is_zero(diff));
}